

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O0

void __thiscall
MADPComponentDiscreteStates::AddState(MADPComponentDiscreteStates *this,string *StateName)

{
  size_type sVar1;
  undefined4 uVar2;
  string *in_RSI;
  StateDiscrete *in_RDI;
  value_type *__x;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  string *name;
  void *in_stack_ffffffffffffff48;
  Index i;
  allocator<char> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  
  if ((in_RDI->super_State).super_NamedDescribedEntity._m_description._M_string_length == 0) {
    in_stack_ffffffffffffff48 = operator_new(0x20);
    StateDistributionVector::StateDistributionVector
              ((StateDistributionVector *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    (in_RDI->super_State).super_NamedDescribedEntity._m_description._M_string_length =
         (size_type)in_stack_ffffffffffffff48;
  }
  i = (Index)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  if (((byte)(in_RDI->super_State).super_NamedDescribedEntity._m_name._M_dataplus & 1) == 0) {
    (in_RDI->super_State).super_NamedDescribedEntity._m_name._M_string_length = 0;
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0xad6344);
    std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>::clear
              ((vector<StateDiscrete,_std::allocator<StateDiscrete>_> *)0xad6352);
    (in_RDI->super_State).super_NamedDescribedEntity._m_name._M_dataplus = (_Alloc_hider)0x1;
  }
  __x = (value_type *)&(in_RDI->super_State).super_NamedDescribedEntity._m_name.field_2;
  sVar1 = (in_RDI->super_State).super_NamedDescribedEntity._m_name._M_string_length;
  (in_RDI->super_State).super_NamedDescribedEntity._m_name._M_string_length = sVar1 + 1;
  uVar2 = (undefined4)sVar1;
  name = (string *)&stack0xffffffffffffff67;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  StateDiscrete::StateDiscrete(in_RDI,i,name,in_RSI);
  std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>::push_back
            ((vector<StateDiscrete,_std::allocator<StateDiscrete>_> *)
             CONCAT44(uVar2,in_stack_ffffffffffffff30),__x);
  StateDiscrete::~StateDiscrete((StateDiscrete *)CONCAT44(uVar2,in_stack_ffffffffffffff30));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)CONCAT44(uVar2,in_stack_ffffffffffffff30),
             (value_type_conflict3 *)__x);
  return;
}

Assistant:

void MADPComponentDiscreteStates::AddState(const string &StateName)
{
    if(_m_initialStateDistribution == 0)
        _m_initialStateDistribution = new StateDistributionVector();
    
    if(!_m_initialized)
    {
        _m_nrStates=0;    
        _m_initialStateDistribution->clear();
        _m_stateVec.clear();

        _m_initialized = true;
    }        
    _m_stateVec.push_back(StateDiscrete( _m_nrStates++, StateName));
    _m_initialStateDistribution->push_back(0.0);
//    _m_nrStates++; - already done...
}